

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::RgbToBgr(RgbToBgrForm4 rgbToBgr,Image *in)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  Image *out;
  ImageTemplate<unsigned_char> *pIVar4;
  undefined8 in_stack_ffffffffffffffc0;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffc8;
  ImageTemplate<unsigned_char> *pIVar5;
  undefined2 uVar3;
  
  pIVar4 = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in_RDI);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar3 = (undefined2)(uVar1 >> 0x10);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (in_stack_ffffffffffffffc8,(uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffc0,(uint8_t)((ushort)uVar3 >> 8),(uint8_t)uVar3);
  pIVar5 = in_RDX;
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  (*in_RSI)(pIVar5,0,0,in_RDI,0,0,uVar1,uVar2);
  return pIVar4;
}

Assistant:

Image RgbToBgr( FunctionTable::RgbToBgrForm4 rgbToBgr,
                    const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height(), RGB );

        rgbToBgr( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }